

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPICodemodel.cxx
# Opt level: O3

Value * __thiscall
anon_unknown.dwarf_c9b666::CodemodelConfig::Dump
          (Value *__return_storage_ptr__,CodemodelConfig *this)

{
  _Rb_tree_header *p_Var1;
  pointer *ppDVar2;
  pointer *ppPVar3;
  undefined8 *puVar4;
  cmStateSnapshot *pcVar5;
  undefined8 *puVar6;
  uint uVar7;
  Project *__p;
  Project *__a;
  cmMakefile *pcVar8;
  pointer ppcVar9;
  pointer ppcVar10;
  ValueHolder this_00;
  pointer pcVar11;
  cmFileAPI *this_01;
  pointer pPVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  CommentInfo *pCVar16;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar17;
  bool bVar18;
  int iVar19;
  TargetType TVar20;
  ArrayIndex AVar21;
  Value *pVVar22;
  pointer pDVar23;
  mapped_type_conflict1 *pmVar24;
  iterator iVar25;
  ulong uVar26;
  pointer pPVar27;
  ulong uVar28;
  cmGlobalGenerator *pcVar29;
  string *psVar30;
  cmLocalGenerator *pcVar31;
  Value *extraout_RAX;
  ValueHolder *pVVar32;
  pointer pDVar33;
  pointer pDVar34;
  Project *pPVar35;
  ValueHolder *pVVar36;
  long lVar37;
  _Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
  *p_Var38;
  pointer pDVar39;
  pointer ppcVar40;
  ValueHolder VVar41;
  __normal_iterator<cmGeneratorTarget_**,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
  __i;
  pointer pDVar42;
  pointer ppcVar43;
  long lVar44;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> targetList;
  cmStateSnapshot ps;
  Value childIndexes;
  string sourceDir;
  string prefix;
  string buildDir;
  Target t;
  cmStateSnapshot parentDir;
  ValueHolder local_658;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_650;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_648 [2];
  pointer local_628;
  string *local_620;
  Value *local_618;
  _Base_ptr local_610;
  ValueHolder local_608;
  ValueHolder *pVStack_600;
  long local_5f8;
  ValueHolder *local_5d8;
  ValueHolder local_5d0;
  ValueHolder VStack_5c8;
  ValueHolder local_5c0;
  ValueHolder local_5a8;
  ValueHolder VStack_5a0;
  ValueHolder local_598 [4];
  ValueHolder local_578;
  ValueHolder VStack_570;
  ValueHolder local_568;
  char *local_548;
  allocator_type *local_540;
  ulong local_538;
  _Base_ptr local_530;
  ValueHolder local_528;
  ValueHolder VStack_520;
  ValueHolder local_518;
  ValueHolder local_500;
  cmStateSnapshot *local_4f8;
  long local_4f0;
  string local_4d8;
  Value local_4b8;
  ValueHolder local_490 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_480;
  string local_468;
  ValueHolder *local_448;
  ulong local_440;
  long local_438;
  map<cmStateSnapshot,_unsigned_int,_cmStateSnapshot::StrictWeakOrder,_std::allocator<std::pair<const_cmStateSnapshot,_unsigned_int>_>_>
  *local_430;
  ValueHolder *local_428;
  Value local_420;
  ValueHolder local_3f8;
  ValueHolder VStack_3f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3e8;
  undefined1 local_3d8 [16];
  char *local_3c8 [2];
  char local_3b8 [16];
  vector<cmSourceGroup,_std::allocator<cmSourceGroup>_> local_3a8;
  ValueHolder local_390;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_388;
  ulong local_380;
  undefined8 uStack_378;
  _Base_ptr *local_370;
  undefined8 local_368;
  undefined8 local_360;
  undefined8 uStack_358;
  undefined4 local_350;
  undefined8 local_348;
  _Base_ptr p_Stack_340;
  _Base_ptr *local_338;
  undefined8 local_330;
  undefined8 local_328;
  undefined8 uStack_320;
  undefined4 local_318;
  undefined8 local_310;
  _Base_ptr p_Stack_308;
  _Base_ptr *local_300;
  undefined8 local_2f8;
  undefined8 local_2f0;
  undefined8 uStack_2e8;
  undefined4 local_2e0;
  undefined8 local_2d8;
  _Base_ptr p_Stack_2d0;
  Value local_2c8;
  Value local_2a0;
  Value local_278;
  _Rb_tree_node_base local_248;
  undefined8 local_228;
  _Base_ptr *local_220;
  undefined8 local_218;
  undefined8 local_210;
  undefined8 uStack_208;
  undefined4 local_200;
  undefined8 local_1f8;
  _Base_ptr p_Stack_1f0;
  Value local_1e8;
  _Base_ptr *local_1c0;
  undefined8 local_1b8;
  undefined8 local_1b0;
  undefined8 uStack_1a8;
  undefined4 local_1a0;
  undefined8 local_198;
  _Base_ptr p_Stack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  _Rb_tree_node_base local_168;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  Value local_120;
  Value local_f8;
  Value local_d0;
  cmStateSnapshot local_a8;
  ValueHolder local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_80;
  ulong local_78;
  ValueHolder local_70;
  ValueHolder VStack_68;
  ValueHolder local_60;
  Value local_58;
  
  local_618 = __return_storage_ptr__;
  Json::Value::Value(__return_storage_ptr__,objectValue);
  Json::Value::Value(&local_58,this->Config);
  pVVar22 = Json::Value::operator[](local_618,"name");
  Json::Value::operator=(pVVar22,&local_58);
  Json::Value::~Value(&local_58);
  pcVar29 = this->FileAPI->CMakeInstance->GlobalGenerator;
  pVVar32 = (ValueHolder *)
            (pcVar29->LocalGenerators).
            super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  pVVar36 = (ValueHolder *)
            (pcVar29->LocalGenerators).
            super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  p_Var38 = (_Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
             *)((long)pVVar36 - (long)pVVar32 >> 3);
  if ((_Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
       *)0x199999999999999 < p_Var38) {
    local_548 = "vector::reserve";
LAB_0029dfa0:
    std::__throw_length_error(local_548);
  }
  pDVar33 = (this->Directories).
            super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((_Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
       *)(((long)(this->Directories).
                 super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pDVar33 >> 4) *
         -0x3333333333333333) < p_Var38) {
    pDVar39 = (this->Directories).
              super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    pDVar23 = std::
              _Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
              ::_M_allocate(p_Var38,(size_t)pVVar36);
    if (pDVar33 != pDVar39) {
      lVar37 = 0;
      do {
        puVar6 = (undefined8 *)((long)&(pDVar33->Snapshot).State + lVar37);
        uVar13 = *puVar6;
        uVar14 = puVar6[1];
        uVar15 = puVar6[3];
        puVar4 = (undefined8 *)((long)&(pDVar23->Snapshot).Position.Position + lVar37);
        *puVar4 = puVar6[2];
        puVar4[1] = uVar15;
        puVar4 = (undefined8 *)((long)&(pDVar23->Snapshot).State + lVar37);
        *puVar4 = uVar13;
        puVar4[1] = uVar14;
        Json::Value::Value((Value *)((long)&(pDVar23->TargetIndexes).value_ + lVar37),
                           (Value *)(puVar6 + 4));
        (&pDVar23->HasInstallRule)[lVar37] = *(bool *)((long)puVar6 + 0x4c);
        *(undefined4 *)((long)&pDVar23->ProjectIndex + lVar37) = *(undefined4 *)(puVar6 + 9);
        lVar37 = lVar37 + 0x50;
      } while ((pointer)(puVar6 + 10) != pDVar39);
    }
    pDVar42 = (this->Directories).
              super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pDVar34 = (this->Directories).
              super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (pDVar42 != pDVar34) {
      do {
        Json::Value::~Value(&pDVar42->TargetIndexes);
        pDVar42 = pDVar42 + 1;
      } while (pDVar42 != pDVar34);
      pDVar42 = (this->Directories).
                super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
                ._M_impl.super__Vector_impl_data._M_start;
    }
    if (pDVar42 != (pointer)0x0) {
      operator_delete(pDVar42,(long)(this->Directories).
                                    super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)pDVar42);
    }
    (this->Directories).
    super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
    ._M_impl.super__Vector_impl_data._M_start = pDVar23;
    (this->Directories).
    super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (pointer)(((long)pDVar39 - (long)pDVar33) + (long)pDVar23);
    (this->Directories).
    super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = pDVar23 + (long)p_Var38;
    pVVar32 = (ValueHolder *)
              (pcVar29->LocalGenerators).
              super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    pVVar36 = (ValueHolder *)
              (pcVar29->LocalGenerators).
              super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    pDVar33 = pDVar23;
  }
  if (pVVar32 != pVVar36) {
    local_610 = (_Base_ptr)&this->DirectoryMap;
    local_430 = &this->ProjectMap;
    local_530 = &(this->DirectoryMap)._M_t._M_impl.super__Rb_tree_header._M_header;
    local_438 = 0x7fffffffffffffd0;
    local_548 = "vector::_M_realloc_insert";
    local_428 = pVVar36;
    do {
      pcVar31 = (cmLocalGenerator *)pVVar32->map_;
      pDVar33 = (this->Directories).
                super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pDVar39 = (this->Directories).
                super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      lVar37 = (long)pDVar39 - (long)pDVar33;
      local_620 = (string *)((lVar37 >> 4) * -0x3333333333333333);
      local_5d8 = pVVar32;
      if (pDVar39 ==
          (this->Directories).
          super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        if (lVar37 == local_438) goto LAB_0029dfa0;
        psVar30 = local_620;
        if (pDVar39 == pDVar33) {
          psVar30 = (string *)0x1;
        }
        p_Var38 = (_Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
                   *)((long)psVar30 + (long)local_620);
        if ((_Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
             *)0x199999999999998 < p_Var38) {
          p_Var38 = (_Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
                     *)0x199999999999999;
        }
        if (CARRY8((ulong)psVar30,(ulong)local_620)) {
          p_Var38 = (_Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
                     *)0x199999999999999;
        }
        pDVar23 = std::
                  _Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
                  ::_M_allocate(p_Var38,(size_t)pVVar36);
        pcVar5 = (cmStateSnapshot *)((long)pDVar23 + lVar37);
        puVar6 = (undefined8 *)((long)&pDVar23->TargetIndexes + lVar37 + 0x20);
        *puVar6 = 0;
        puVar6[1] = 0;
        puVar6 = (undefined8 *)((long)&pDVar23->TargetIndexes + lVar37 + 0x10);
        *puVar6 = 0;
        puVar6[1] = 0;
        puVar6 = (undefined8 *)((long)&pDVar23->TargetIndexes + lVar37);
        *puVar6 = 0;
        puVar6[1] = 0;
        puVar6 = (undefined8 *)((long)&pDVar23->Snapshot + lVar37 + 0x10);
        *puVar6 = 0;
        puVar6[1] = 0;
        *(undefined8 *)((long)pDVar23 + lVar37) = 0;
        ((undefined8 *)((long)pDVar23 + lVar37))[1] = 0;
        cmStateSnapshot::cmStateSnapshot(pcVar5,(cmState *)0x0);
        pcVar5[1].State = (cmState *)0x0;
        Json::Value::Value((Value *)&pcVar5[1].Position,arrayValue);
        *(undefined1 *)((long)&pcVar5[3].State + 4) = 0;
        pDVar34 = pDVar23;
        if (pDVar39 != pDVar33) {
          lVar37 = 0;
          local_628 = (pointer)&pcVar5[1].Position;
          do {
            lVar44 = lVar37;
            puVar6 = (undefined8 *)((long)&(pDVar33->Snapshot).State + lVar44);
            uVar13 = *puVar6;
            uVar14 = puVar6[1];
            uVar15 = puVar6[3];
            puVar4 = (undefined8 *)((long)&(pDVar23->Snapshot).Position.Position + lVar44);
            *puVar4 = puVar6[2];
            puVar4[1] = uVar15;
            puVar4 = (undefined8 *)((long)&(pDVar23->Snapshot).State + lVar44);
            *puVar4 = uVar13;
            puVar4[1] = uVar14;
            Json::Value::Value((Value *)((long)&(pDVar23->TargetIndexes).value_ + lVar44),
                               (Value *)(puVar6 + 4));
            (&pDVar23->HasInstallRule)[lVar44] = *(bool *)((long)puVar6 + 0x4c);
            *(undefined4 *)((long)&pDVar23->ProjectIndex + lVar44) = *(undefined4 *)(puVar6 + 9);
            pDVar34 = pDVar33;
            lVar37 = lVar44 + 0x50;
          } while ((pointer)(puVar6 + 10) != pDVar39);
          do {
            Json::Value::~Value(&pDVar34->TargetIndexes);
            pDVar34 = pDVar34 + 1;
          } while (pDVar34 != pDVar39);
          pDVar34 = (pointer)((long)&pDVar23[1].Snapshot.State + lVar44);
        }
        if (pDVar33 != (pointer)0x0) {
          operator_delete(pDVar33,(long)(this->Directories).
                                        super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)pDVar33);
        }
        (this->Directories).
        super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
        ._M_impl.super__Vector_impl_data._M_start = pDVar23;
        (this->Directories).
        super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
        ._M_impl.super__Vector_impl_data._M_finish = pDVar34 + 1;
        (this->Directories).
        super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = pDVar23 + (long)p_Var38;
      }
      else {
        (pDVar39->TargetIndexes).limit_ = 0;
        pDVar39->ProjectIndex = 0;
        pDVar39->HasInstallRule = false;
        *(undefined3 *)&pDVar39->field_0x4d = 0;
        (pDVar39->TargetIndexes).comments_ = (CommentInfo *)0x0;
        (pDVar39->TargetIndexes).start_ = 0;
        (pDVar39->TargetIndexes).value_.int_ = 0;
        *(undefined8 *)&(pDVar39->TargetIndexes).field_0x8 = 0;
        (pDVar39->Snapshot).Position.Position = 0;
        pDVar39->LocalGenerator = (cmLocalGenerator *)0x0;
        (pDVar39->Snapshot).State = (cmState *)0x0;
        (pDVar39->Snapshot).Position.Tree = (cmLinkedTree<cmStateDetail::SnapshotDataType> *)0x0;
        cmStateSnapshot::cmStateSnapshot(&pDVar39->Snapshot,(cmState *)0x0);
        pDVar39->LocalGenerator = (cmLocalGenerator *)0x0;
        Json::Value::Value(&pDVar39->TargetIndexes,arrayValue);
        pDVar39->HasInstallRule = false;
        ppDVar2 = &(this->Directories).
                   super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppDVar2 = *ppDVar2 + 1;
        pDVar23 = (this->Directories).
                  super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      }
      cmLocalGenerator::GetStateSnapshot((cmStateSnapshot *)&local_658,pcVar31);
      cmStateSnapshot::GetBuildsystemDirectory
                ((cmStateSnapshot *)&local_3f8,(cmStateSnapshot *)&local_658);
      pVVar32 = (ValueHolder *)(pDVar23 + ((ulong)local_620 & 0xffffffff));
      pVVar32[2] = (ValueHolder)local_3e8._M_allocated_capacity;
      *pVVar32 = local_3f8;
      pVVar32[1] = VStack_3f0;
      pVVar32[3].map_ = (ObjectValues *)pcVar31;
      pmVar24 = std::
                map<cmStateSnapshot,_unsigned_int,_cmStateSnapshot::StrictWeakOrder,_std::allocator<std::pair<const_cmStateSnapshot,_unsigned_int>_>_>
                ::operator[]((map<cmStateSnapshot,_unsigned_int,_cmStateSnapshot::StrictWeakOrder,_std::allocator<std::pair<const_cmStateSnapshot,_unsigned_int>_>_>
                              *)local_610,(key_type *)pVVar32);
      *pmVar24 = (mapped_type_conflict1)local_620;
      local_598[0] = pVVar32[2];
      local_5a8 = *pVVar32;
      VStack_5a0 = pVVar32[1];
      local_578 = local_5a8;
      VStack_570 = VStack_5a0;
      local_568 = local_598[0];
      cmStateSnapshot::GetBuildsystemDirectoryParent
                ((cmStateSnapshot *)&local_5d0,(cmStateSnapshot *)&local_578);
      bVar18 = cmStateSnapshot::IsValid((cmStateSnapshot *)&local_5d0);
      if (bVar18) {
        cmStateSnapshot::GetProjectName_abi_cxx11_
                  ((string *)&local_3f8,(cmStateSnapshot *)&local_5d0);
        cmStateSnapshot::GetProjectName_abi_cxx11_
                  ((string *)&local_658,(cmStateSnapshot *)&local_578);
        VVar41 = local_658;
        if (VStack_3f0 == paStack_650) {
          if (VStack_3f0 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            bVar18 = true;
          }
          else {
            iVar19 = bcmp(local_3f8.string_,local_658.string_,VStack_3f0.uint_);
            bVar18 = iVar19 == 0;
          }
        }
        else {
          bVar18 = false;
        }
        if (VVar41 != local_648) {
          operator_delete(VVar41.string_,local_648[0]._M_allocated_capacity + 1);
        }
        if (local_3f8 != &local_3e8) {
          operator_delete(local_3f8.string_,(ulong)(local_3e8._M_allocated_capacity + 1));
        }
        if (!bVar18) goto LAB_0029ca5c;
        local_3e8._M_allocated_capacity = (size_type)local_5c0;
        local_3f8 = local_5d0;
        VStack_3f0 = VStack_5c8;
        iVar25 = std::
                 _Rb_tree<cmStateSnapshot,_std::pair<const_cmStateSnapshot,_unsigned_int>,_std::_Select1st<std::pair<const_cmStateSnapshot,_unsigned_int>_>,_cmStateSnapshot::StrictWeakOrder,_std::allocator<std::pair<const_cmStateSnapshot,_unsigned_int>_>_>
                 ::find(local_610,(key_type *)&local_3f8);
        if (iVar25._M_node == local_530) goto LAB_0029df72;
        AVar21 = (this->Directories).
                 super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
                 ._M_impl.super__Vector_impl_data._M_start[*(uint *)&iVar25._M_node[1]._M_right].
                 ProjectIndex;
      }
      else {
LAB_0029ca5c:
        __p = (this->Projects).
              super__Vector_base<(anonymous_namespace)::CodemodelConfig::Project,_std::allocator<(anonymous_namespace)::CodemodelConfig::Project>_>
              ._M_impl.super__Vector_impl_data._M_start;
        __a = (this->Projects).
              super__Vector_base<(anonymous_namespace)::CodemodelConfig::Project,_std::allocator<(anonymous_namespace)::CodemodelConfig::Project>_>
              ._M_impl.super__Vector_impl_data._M_finish;
        lVar37 = (long)__a - (long)__p >> 3;
        uVar28 = lVar37 * -0x79435e50d79435e5;
        if (__a == (this->Projects).
                   super__Vector_base<(anonymous_namespace)::CodemodelConfig::Project,_std::allocator<(anonymous_namespace)::CodemodelConfig::Project>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          if ((long)__a - (long)__p == 0x7fffffffffffffc8) goto LAB_0029dfa0;
          uVar26 = uVar28;
          if (__a == __p) {
            uVar26 = 1;
          }
          local_538 = uVar26 + uVar28;
          if (0xd79435e50d7942 < local_538) {
            local_538 = 0xd79435e50d7943;
          }
          if (CARRY8(uVar26,uVar28)) {
            local_538 = 0xd79435e50d7943;
          }
          pPVar35 = __p;
          if (local_538 == 0) {
            pPVar27 = (pointer)0x0;
          }
          else {
            pPVar27 = (pointer)operator_new(local_538 * 0x98);
          }
          local_540 = (allocator_type *)(&(pPVar27->Snapshot).State + lVar37);
          std::allocator_traits<std::allocator<(anonymous_namespace)::CodemodelConfig::Project>_>::
          construct<(anonymous_namespace)::CodemodelConfig::Project>(local_540,pPVar35);
          local_628 = pPVar27;
          if (__a != __p) {
            lVar37 = 0;
            local_448 = pVVar32;
            local_440 = uVar28;
            do {
              lVar44 = lVar37;
              pPVar27 = local_628;
              puVar6 = (undefined8 *)((long)&(__p->Snapshot).State + lVar44);
              uVar13 = *puVar6;
              pCVar16 = (CommentInfo *)puVar6[1];
              uVar14 = *(undefined8 *)((long)puVar6 + 0x14);
              pVVar22 = (Value *)((long)&(local_628->ChildIndexes).value_ + lVar44);
              *(undefined8 *)((long)&pVVar22[-1].comments_ + 4) =
                   *(undefined8 *)((long)puVar6 + 0xc);
              *(undefined8 *)((long)&pVVar22[-1].start_ + 4) = uVar14;
              *(undefined8 *)&pVVar22[-1].field_0x8 = uVar13;
              pVVar22[-1].comments_ = pCVar16;
              Json::Value::Value(pVVar22,(Value *)(puVar6 + 4));
              Json::Value::Value((Value *)((long)&(pPVar27->DirectoryIndexes).value_ + lVar44),
                                 (Value *)(puVar6 + 9));
              Json::Value::Value((Value *)((long)&(pPVar27->TargetIndexes).value_ + lVar44),
                                 (Value *)(puVar6 + 0xe));
              lVar37 = lVar44 + 0x98;
              pPVar35 = __p;
            } while ((Project *)(puVar6 + 0x13) != __a);
            do {
              Json::Value::~Value(&pPVar35->TargetIndexes);
              Json::Value::~Value(&pPVar35->DirectoryIndexes);
              Json::Value::~Value(&pPVar35->ChildIndexes);
              pPVar35 = pPVar35 + 1;
            } while (pPVar35 != __a);
            pPVar27 = (pointer)((long)&local_628[1].Snapshot.State + lVar44);
            uVar28 = local_440;
            pVVar32 = local_448;
          }
          if (__p != (Project *)0x0) {
            operator_delete(__p,(long)(this->Projects).
                                      super__Vector_base<(anonymous_namespace)::CodemodelConfig::Project,_std::allocator<(anonymous_namespace)::CodemodelConfig::Project>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)__p
                           );
          }
          (this->Projects).
          super__Vector_base<(anonymous_namespace)::CodemodelConfig::Project,_std::allocator<(anonymous_namespace)::CodemodelConfig::Project>_>
          ._M_impl.super__Vector_impl_data._M_start = local_628;
          (this->Projects).
          super__Vector_base<(anonymous_namespace)::CodemodelConfig::Project,_std::allocator<(anonymous_namespace)::CodemodelConfig::Project>_>
          ._M_impl.super__Vector_impl_data._M_finish = pPVar27 + 1;
          (this->Projects).
          super__Vector_base<(anonymous_namespace)::CodemodelConfig::Project,_std::allocator<(anonymous_namespace)::CodemodelConfig::Project>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = local_628 + local_538;
          pPVar27 = local_628;
        }
        else {
          std::allocator_traits<std::allocator<(anonymous_namespace)::CodemodelConfig::Project>_>::
          construct<(anonymous_namespace)::CodemodelConfig::Project>((allocator_type *)__a,__p);
          ppPVar3 = &(this->Projects).
                     super__Vector_base<(anonymous_namespace)::CodemodelConfig::Project,_std::allocator<(anonymous_namespace)::CodemodelConfig::Project>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          *ppPVar3 = *ppPVar3 + 1;
          pPVar27 = (this->Projects).
                    super__Vector_base<(anonymous_namespace)::CodemodelConfig::Project,_std::allocator<(anonymous_namespace)::CodemodelConfig::Project>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        }
        AVar21 = (ArrayIndex)uVar28;
        uVar28 = uVar28 & 0xffffffff;
        *(ValueHolder *)&pPVar27[uVar28].Snapshot.Position.Position = local_568;
        *(ValueHolder *)(pPVar27 + uVar28) = local_578;
        ((ValueHolder *)(pPVar27 + uVar28))[1] = VStack_570;
        pmVar24 = std::
                  map<cmStateSnapshot,_unsigned_int,_cmStateSnapshot::StrictWeakOrder,_std::allocator<std::pair<const_cmStateSnapshot,_unsigned_int>_>_>
                  ::operator[](local_430,(key_type *)&local_578);
        *pmVar24 = AVar21;
        bVar18 = cmStateSnapshot::IsValid((cmStateSnapshot *)&local_5d0);
        if (bVar18) {
          local_3e8._M_allocated_capacity = (size_type)local_5c0;
          local_3f8 = local_5d0;
          VStack_3f0 = VStack_5c8;
          iVar25 = std::
                   _Rb_tree<cmStateSnapshot,_std::pair<const_cmStateSnapshot,_unsigned_int>,_std::_Select1st<std::pair<const_cmStateSnapshot,_unsigned_int>_>,_cmStateSnapshot::StrictWeakOrder,_std::allocator<std::pair<const_cmStateSnapshot,_unsigned_int>_>_>
                   ::find(local_610,(key_type *)&local_3f8);
          if (iVar25._M_node == local_530) goto LAB_0029df72;
          uVar7 = (this->Directories).
                  super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
                  ._M_impl.super__Vector_impl_data._M_start[*(uint *)&iVar25._M_node[1]._M_right].
                  ProjectIndex;
          pPVar27[uVar28].ParentIndex = uVar7;
          pPVar27 = (this->Projects).
                    super__Vector_base<(anonymous_namespace)::CodemodelConfig::Project,_std::allocator<(anonymous_namespace)::CodemodelConfig::Project>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          Json::Value::Value((Value *)&local_3f8,AVar21);
          Json::Value::append(&pPVar27[uVar7].ChildIndexes,(Value *)&local_3f8);
          Json::Value::~Value((Value *)&local_3f8);
        }
      }
      *(ArrayIndex *)(pVVar32 + 9) = AVar21;
      pPVar27 = (this->Projects).
                super__Vector_base<(anonymous_namespace)::CodemodelConfig::Project,_std::allocator<(anonymous_namespace)::CodemodelConfig::Project>_>
                ._M_impl.super__Vector_impl_data._M_start;
      Json::Value::Value((Value *)&local_3f8,(UInt)local_620);
      pVVar36 = &local_3f8;
      Json::Value::append(&pPVar27[AVar21].DirectoryIndexes,(Value *)&local_3f8);
      Json::Value::~Value((Value *)&local_3f8);
      pVVar32 = local_5d8 + 1;
    } while (pVVar32 != local_428);
    pDVar33 = (this->Directories).
              super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
              ._M_impl.super__Vector_impl_data._M_start;
  }
  pDVar39 = (this->Directories).
            super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (pDVar39 != pDVar33) {
    do {
      pcVar8 = (pDVar39[-1].LocalGenerator)->Makefile;
      ppcVar9 = (pcVar8->InstallGenerators).
                super__Vector_base<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      for (ppcVar43 = (pcVar8->InstallGenerators).
                      super__Vector_base<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>
                      ._M_impl.super__Vector_impl_data._M_start; ppcVar43 != ppcVar9;
          ppcVar43 = ppcVar43 + 1) {
        if ((*ppcVar43 == (cmInstallGenerator *)0x0) ||
           (lVar37 = __dynamic_cast(*ppcVar43,&cmInstallGenerator::typeinfo,
                                    &cmInstallSubdirectoryGenerator::typeinfo,0), lVar37 == 0)) {
          pDVar39[-1].HasInstallRule = true;
          break;
        }
      }
      pDVar33 = pDVar39 + -1;
      if (pDVar39[-1].HasInstallRule == false) {
        cmStateSnapshot::GetChildren
                  ((vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_> *)&local_658,
                   &pDVar33->Snapshot);
        paVar17 = paStack_650;
        for (VVar41 = local_658; VVar41 != paVar17;
            VVar41.string_ = (char *)((long)&(VVar41.map_)->_M_t + 0x18)) {
          cmStateSnapshot::GetBuildsystemDirectory
                    ((cmStateSnapshot *)&local_5d0,(cmStateSnapshot *)VVar41.map_);
          local_3e8._M_allocated_capacity = (size_type)local_5c0;
          local_3f8 = local_5d0;
          VStack_3f0 = VStack_5c8;
          iVar25 = std::
                   _Rb_tree<cmStateSnapshot,_std::pair<const_cmStateSnapshot,_unsigned_int>,_std::_Select1st<std::pair<const_cmStateSnapshot,_unsigned_int>_>,_cmStateSnapshot::StrictWeakOrder,_std::allocator<std::pair<const_cmStateSnapshot,_unsigned_int>_>_>
                   ::find(&(this->DirectoryMap)._M_t,(key_type *)&local_3f8);
          if ((_Rb_tree_header *)iVar25._M_node ==
              &(this->DirectoryMap)._M_t._M_impl.super__Rb_tree_header) goto LAB_0029df72;
          if ((this->Directories).
              super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
              ._M_impl.super__Vector_impl_data._M_start[*(uint *)&iVar25._M_node[1]._M_right].
              HasInstallRule == true) {
            pDVar39[-1].HasInstallRule = true;
            break;
          }
        }
        if (local_658 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          operator_delete(local_658.string_,local_648[0]._M_allocated_capacity - (long)local_658);
        }
      }
      pDVar39 = pDVar33;
    } while (pDVar33 !=
             (this->Directories).
             super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
             ._M_impl.super__Vector_impl_data._M_start);
  }
  Json::Value::Value(&local_120,arrayValue);
  local_608.int_ = 0;
  pVStack_600 = (ValueHolder *)0x0;
  local_5f8 = 0;
  pcVar29 = this->FileAPI->CMakeInstance->GlobalGenerator;
  ppcVar40 = (pcVar29->LocalGenerators).
             super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  ppcVar10 = (pcVar29->LocalGenerators).
             super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
  if (ppcVar40 != ppcVar10) {
    do {
      std::vector<cmGeneratorTarget*,std::allocator<cmGeneratorTarget*>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<cmGeneratorTarget*const*,std::vector<cmGeneratorTarget*,std::allocator<cmGeneratorTarget*>>>>
                ((vector<cmGeneratorTarget*,std::allocator<cmGeneratorTarget*>> *)&local_608,
                 pVStack_600,
                 ((*ppcVar40)->GeneratorTargets).
                 super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                 _M_impl.super__Vector_impl_data._M_start,
                 ((*ppcVar40)->GeneratorTargets).
                 super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish);
      pVVar32 = pVStack_600;
      VVar41 = local_608;
      ppcVar40 = ppcVar40 + 1;
    } while (ppcVar40 != ppcVar10);
    if (local_608 != pVStack_600) {
      lVar44 = (long)pVStack_600 - (long)local_608;
      uVar28 = lVar44 >> 3;
      lVar37 = 0x3f;
      if (uVar28 != 0) {
        for (; uVar28 >> lVar37 == 0; lVar37 = lVar37 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<cmGeneratorTarget**,std::vector<cmGeneratorTarget*,std::allocator<cmGeneratorTarget*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<(anonymous_namespace)::CodemodelConfig::DumpTargets()::__0>>
                (local_608.int_,pVStack_600,((uint)lVar37 ^ 0x3f) * 2 ^ 0x7e);
      if (lVar44 < 0x81) {
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<cmGeneratorTarget**,std::vector<cmGeneratorTarget*,std::allocator<cmGeneratorTarget*>>>,__gnu_cxx::__ops::_Iter_comp_iter<(anonymous_namespace)::CodemodelConfig::DumpTargets()::__0>>
                  (VVar41.int_,pVVar32);
      }
      else {
        pVVar36 = (ValueHolder *)(VVar41.int_ + 0x80);
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<cmGeneratorTarget**,std::vector<cmGeneratorTarget*,std::allocator<cmGeneratorTarget*>>>,__gnu_cxx::__ops::_Iter_comp_iter<(anonymous_namespace)::CodemodelConfig::DumpTargets()::__0>>
                  (VVar41.int_,pVVar36);
        for (; pVVar36 != pVVar32; pVVar36 = pVVar36 + 1) {
          std::
          __unguarded_linear_insert<__gnu_cxx::__normal_iterator<cmGeneratorTarget**,std::vector<cmGeneratorTarget*,std::allocator<cmGeneratorTarget*>>>,__gnu_cxx::__ops::_Val_comp_iter<(anonymous_namespace)::CodemodelConfig::DumpTargets()::__0>>
                    (pVVar36);
        }
      }
    }
  }
  pVVar32 = pVStack_600;
  if (local_608 != pVStack_600) {
    local_620 = &this->TopBuild;
    local_5d8 = (ValueHolder *)&this->DirectoryMap;
    local_610 = &(this->DirectoryMap)._M_t._M_impl.super__Rb_tree_header._M_header;
    VVar41 = local_608;
    do {
      this_00.int_ = *VVar41.int_;
      TVar20 = cmGeneratorTarget::GetType((cmGeneratorTarget *)this_00.map_);
      if ((TVar20 != GLOBAL_TARGET) &&
         (TVar20 = cmGeneratorTarget::GetType((cmGeneratorTarget *)this_00.map_),
         TVar20 != INTERFACE_LIBRARY)) {
        AVar21 = Json::Value::size(&local_120);
        local_628 = (pointer)CONCAT44(local_628._4_4_,AVar21);
        VStack_3f0 = (ValueHolder)this->Config;
        local_3f8 = this_00;
        pcVar29 = cmGeneratorTarget::GetGlobalGenerator((cmGeneratorTarget *)this_00.map_);
        psVar30 = cmake::GetHomeDirectory_abi_cxx11_(pcVar29->CMakeInstance);
        local_3e8._M_allocated_capacity = (size_type)local_3d8;
        pcVar11 = (psVar30->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_3e8,pcVar11,pcVar11 + psVar30->_M_string_length);
        pcVar29 = cmGeneratorTarget::GetGlobalGenerator((cmGeneratorTarget *)this_00.map_);
        psVar30 = cmake::GetHomeOutputDirectory_abi_cxx11_(pcVar29->CMakeInstance);
        local_3c8[0] = local_3b8;
        pcVar11 = (psVar30->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_3c8,pcVar11,pcVar11 + psVar30->_M_string_length);
        std::vector<cmSourceGroup,_std::allocator<cmSourceGroup>_>::vector
                  (&local_3a8,
                   &(*(cmMakefile **)
                      (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)&(local_3f8.map_)->_M_t)->_M_local_buf + 8))->SourceGroups);
        local_658.string_ = (char *)local_648;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_658,local_3e8._M_allocated_capacity,
                   (char *)(local_3e8._8_8_ + local_3e8._M_allocated_capacity));
        local_390.string_ = (char *)&local_380;
        if (local_658 == local_648) {
          uStack_378 = local_648[0]._8_8_;
        }
        else {
          local_390.int_ = local_658.int_;
        }
        local_380 = local_648[0]._M_allocated_capacity;
        local_388 = paStack_650;
        paStack_650 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)0x0;
        local_648[0]._M_allocated_capacity = local_648[0]._M_allocated_capacity & 0xffffffffffffff00
        ;
        local_370 = &p_Stack_340;
        local_368 = 1;
        local_360 = 0;
        uStack_358 = 0;
        local_350 = 0x3f800000;
        local_348 = 0;
        p_Stack_340 = (_Base_ptr)0x0;
        local_338 = &p_Stack_308;
        local_330 = 1;
        local_328 = 0;
        uStack_320 = 0;
        local_318 = 0x3f800000;
        local_310 = 0;
        p_Stack_308 = (_Base_ptr)0x0;
        local_300 = &p_Stack_2d0;
        local_2f8 = 1;
        local_2f0 = 0;
        uStack_2e8 = 0;
        local_2e0 = 0x3f800000;
        local_2d8 = 0;
        p_Stack_2d0 = (_Base_ptr)0x0;
        local_658.string_ = (char *)local_648;
        Json::Value::Value(&local_2c8,arrayValue);
        Json::Value::Value(&local_2a0,arrayValue);
        Json::Value::Value(&local_278,arrayValue);
        if (local_658 != local_648) {
          operator_delete(local_658.string_,local_648[0]._M_allocated_capacity + 1);
        }
        local_248._M_color = _S_red;
        local_248._M_parent = (_Base_ptr)0x0;
        local_248._M_left = &local_248;
        local_228 = 0;
        local_220 = &p_Stack_1f0;
        local_218 = 1;
        local_210 = 0;
        uStack_208 = 0;
        local_200 = 0x3f800000;
        local_1f8 = 0;
        p_Stack_1f0 = (_Base_ptr)0x0;
        local_248._M_right = local_248._M_left;
        Json::Value::Value(&local_1e8,arrayValue);
        local_1c0 = &p_Stack_190;
        local_1b8 = 1;
        local_1b0 = 0;
        uStack_1a8 = 0;
        local_1a0 = 0x3f800000;
        local_168._M_color = _S_red;
        local_168._M_parent = (_Base_ptr)0x0;
        local_178 = 0;
        local_188 = 0;
        uStack_180 = 0;
        local_198 = 0;
        p_Stack_190 = (_Base_ptr)0x0;
        local_168._M_left = &local_168;
        local_138 = 0;
        uStack_130 = 0;
        local_148 = 0;
        uStack_140 = 0;
        local_168._M_right = local_168._M_left;
        psVar30 = cmGeneratorTarget::GetName_abi_cxx11_((cmGeneratorTarget *)this_00.map_);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_490,"target-",psVar30);
        if (this->Config->_M_string_length != 0) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_658,"-",this->Config);
          std::__cxx11::string::_M_append((char *)&local_490[0].int_,local_658.uint_);
          if (local_658 != local_648) {
            operator_delete(local_658.string_,local_648[0]._M_allocated_capacity + 1);
          }
        }
        this_01 = this->FileAPI;
        Target::Dump((Value *)&local_658,(Target *)&local_3f8);
        cmFileAPI::MaybeJsonFile(&local_420,this_01,(Value *)&local_658,(string *)local_490);
        Json::Value::~Value((Value *)&local_658);
        psVar30 = cmGeneratorTarget::GetName_abi_cxx11_((cmGeneratorTarget *)this_00.map_);
        Json::Value::Value((Value *)&local_5d0,psVar30);
        pVVar22 = Json::Value::operator[](&local_420,"name");
        Json::Value::operator=(pVVar22,(Value *)&local_5d0);
        Json::Value::~Value((Value *)&local_5d0);
        TargetId((string *)&local_5a8,(cmGeneratorTarget *)this_00.map_,local_620);
        Json::Value::Value((Value *)&local_578,(string *)&local_5a8);
        pVVar22 = Json::Value::operator[](&local_420,"id");
        Json::Value::operator=(pVVar22,(Value *)&local_578);
        Json::Value::~Value((Value *)&local_578);
        if (local_5a8 != local_598) {
          operator_delete(local_5a8.string_,local_598[0].int_ + 1);
        }
        pcVar31 = cmGeneratorTarget::GetLocalGenerator((cmGeneratorTarget *)this_00.map_);
        cmLocalGenerator::GetStateSnapshot((cmStateSnapshot *)&local_500,pcVar31);
        cmStateSnapshot::GetBuildsystemDirectory
                  ((cmStateSnapshot *)&local_528,(cmStateSnapshot *)&local_500);
        local_598[0] = local_518;
        local_5a8 = local_528;
        VStack_5a0 = VStack_520;
        iVar25 = std::
                 _Rb_tree<cmStateSnapshot,_std::pair<const_cmStateSnapshot,_unsigned_int>,_std::_Select1st<std::pair<const_cmStateSnapshot,_unsigned_int>_>,_cmStateSnapshot::StrictWeakOrder,_std::allocator<std::pair<const_cmStateSnapshot,_unsigned_int>_>_>
                 ::find((_Rb_tree<cmStateSnapshot,_std::pair<const_cmStateSnapshot,_unsigned_int>,_std::_Select1st<std::pair<const_cmStateSnapshot,_unsigned_int>_>,_cmStateSnapshot::StrictWeakOrder,_std::allocator<std::pair<const_cmStateSnapshot,_unsigned_int>_>_>
                         *)local_5d8,(key_type *)&local_5a8);
        if (iVar25._M_node == local_610) goto LAB_0029df72;
        uVar7 = *(uint *)&iVar25._M_node[1]._M_right;
        Json::Value::Value((Value *)&local_5a8,uVar7);
        pVVar22 = Json::Value::operator[](&local_420,"directoryIndex");
        Json::Value::operator=(pVVar22,(Value *)&local_5a8);
        Json::Value::~Value((Value *)&local_5a8);
        pDVar33 = (this->Directories).
                  super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        Json::Value::Value((Value *)&local_528,(UInt)local_628);
        Json::Value::append(&pDVar33[uVar7].TargetIndexes,(Value *)&local_528);
        Json::Value::~Value((Value *)&local_528);
        uVar7 = (this->Directories).
                super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar7].ProjectIndex;
        Json::Value::Value((Value *)&local_528,uVar7);
        pVVar22 = Json::Value::operator[](&local_420,"projectIndex");
        Json::Value::operator=(pVVar22,(Value *)&local_528);
        Json::Value::~Value((Value *)&local_528);
        pPVar27 = (this->Projects).
                  super__Vector_base<(anonymous_namespace)::CodemodelConfig::Project,_std::allocator<(anonymous_namespace)::CodemodelConfig::Project>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        Json::Value::Value((Value *)&local_500,(UInt)local_628);
        Json::Value::append(&pPVar27[uVar7].TargetIndexes,(Value *)&local_500);
        Json::Value::~Value((Value *)&local_500);
        if (local_490[0] != &local_480) {
          operator_delete(local_490[0].string_,local_480._M_allocated_capacity + 1);
        }
        Target::~Target((Target *)&local_3f8);
        Json::Value::append(&local_120,&local_420);
        Json::Value::~Value(&local_420);
      }
      VVar41.string_ = (char *)((ValueHolder *)&(VVar41.map_)->_M_t + 1);
    } while ((ValueHolder *)VVar41.int_ != pVVar32);
  }
  if (local_608 != (ValueHolder *)0x0) {
    operator_delete(local_608.string_,local_5f8 - (long)local_608);
  }
  pVVar22 = Json::Value::operator[](local_618,"targets");
  Json::Value::operator=(pVVar22,&local_120);
  Json::Value::~Value(&local_120);
  Json::Value::Value(&local_d0,arrayValue);
  pDVar33 = (this->Directories).
            super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pDVar39 = (this->Directories).
            super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (pDVar33 != pDVar39) {
    local_628 = (pointer)&this->TopSource;
    local_620 = &this->TopBuild;
    p_Var1 = &(this->DirectoryMap)._M_t._M_impl.super__Rb_tree_header;
    do {
      Json::Value::Value(&local_4b8,objectValue);
      cmStateSnapshot::GetDirectory((cmStateDirectory *)&local_3f8,&pDVar33->Snapshot);
      psVar30 = cmStateDirectory::GetCurrentSource_abi_cxx11_((cmStateDirectory *)&local_3f8);
      local_4d8._M_dataplus._M_p = (pointer)&local_4d8.field_2;
      pcVar11 = (psVar30->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_4d8,pcVar11,pcVar11 + psVar30->_M_string_length);
      RelativeIfUnder((string *)&local_3f8,(string *)local_628,&local_4d8);
      Json::Value::Value((Value *)&local_5d0,(string *)&local_3f8);
      pVVar22 = Json::Value::operator[](&local_4b8,"source");
      Json::Value::operator=(pVVar22,(Value *)&local_5d0);
      Json::Value::~Value((Value *)&local_5d0);
      if (local_3f8 != &local_3e8) {
        operator_delete(local_3f8.string_,(ulong)(local_3e8._M_allocated_capacity + 1));
      }
      cmStateSnapshot::GetDirectory((cmStateDirectory *)&local_3f8,&pDVar33->Snapshot);
      psVar30 = cmStateDirectory::GetCurrentBinary_abi_cxx11_((cmStateDirectory *)&local_3f8);
      local_468._M_dataplus._M_p = (pointer)&local_468.field_2;
      pcVar11 = (psVar30->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_468,pcVar11,pcVar11 + psVar30->_M_string_length);
      RelativeIfUnder((string *)&local_3f8,local_620,&local_468);
      Json::Value::Value((Value *)&local_578,(string *)&local_3f8);
      pVVar22 = Json::Value::operator[](&local_4b8,"build");
      Json::Value::operator=(pVVar22,(Value *)&local_578);
      Json::Value::~Value((Value *)&local_578);
      if (local_3f8 != &local_3e8) {
        operator_delete(local_3f8.string_,(ulong)(local_3e8._M_allocated_capacity + 1));
      }
      cmStateSnapshot::GetBuildsystemDirectoryParent
                ((cmStateSnapshot *)&local_70,&pDVar33->Snapshot);
      bVar18 = cmStateSnapshot::IsValid((cmStateSnapshot *)&local_70);
      if (bVar18) {
        local_3e8._M_allocated_capacity = (size_type)local_60;
        local_3f8 = local_70;
        VStack_3f0 = VStack_68;
        iVar25 = std::
                 _Rb_tree<cmStateSnapshot,_std::pair<const_cmStateSnapshot,_unsigned_int>,_std::_Select1st<std::pair<const_cmStateSnapshot,_unsigned_int>_>,_cmStateSnapshot::StrictWeakOrder,_std::allocator<std::pair<const_cmStateSnapshot,_unsigned_int>_>_>
                 ::find(&(this->DirectoryMap)._M_t,(key_type *)&local_3f8);
        if ((_Rb_tree_header *)iVar25._M_node == p_Var1) {
LAB_0029df72:
          __assert_fail("i != this->DirectoryMap.end()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmFileAPICodemodel.cxx"
                        ,0x1bd,
                        "Json::ArrayIndex (anonymous namespace)::CodemodelConfig::GetDirectoryIndex(cmStateSnapshot)"
                       );
        }
        Json::Value::Value((Value *)&local_5a8,*(UInt *)&iVar25._M_node[1]._M_right);
        pVVar22 = Json::Value::operator[](&local_4b8,"parentIndex");
        Json::Value::operator=(pVVar22,(Value *)&local_5a8);
        Json::Value::~Value((Value *)&local_5a8);
      }
      Json::Value::Value((Value *)&local_528,arrayValue);
      cmStateSnapshot::GetChildren
                ((vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_> *)&local_500,
                 &pDVar33->Snapshot);
      pcVar5 = local_4f8;
      for (VVar41 = local_500; VVar41 != pcVar5;
          VVar41.string_ =
               (char *)&((VVar41.map_)->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left) {
        cmStateSnapshot::GetBuildsystemDirectory
                  ((cmStateSnapshot *)&local_88,(cmStateSnapshot *)VVar41.map_);
        local_648[0]._M_allocated_capacity = local_78;
        local_658 = local_88;
        paStack_650 = paStack_80;
        iVar25 = std::
                 _Rb_tree<cmStateSnapshot,_std::pair<const_cmStateSnapshot,_unsigned_int>,_std::_Select1st<std::pair<const_cmStateSnapshot,_unsigned_int>_>,_cmStateSnapshot::StrictWeakOrder,_std::allocator<std::pair<const_cmStateSnapshot,_unsigned_int>_>_>
                 ::find(&(this->DirectoryMap)._M_t,(key_type *)&local_658);
        if ((_Rb_tree_header *)iVar25._M_node == p_Var1) goto LAB_0029df72;
        Json::Value::Value((Value *)&local_3f8,*(UInt *)&iVar25._M_node[1]._M_right);
        Json::Value::append((Value *)&local_528,(Value *)&local_3f8);
        Json::Value::~Value((Value *)&local_3f8);
      }
      if (local_500 != (cmStateSnapshot *)0x0) {
        operator_delete(local_500.string_,local_4f0 - (long)local_500);
      }
      bVar18 = Json::Value::empty((Value *)&local_528);
      if (!bVar18) {
        Json::Value::Value((Value *)&local_500,(Value *)&local_528);
        pVVar22 = Json::Value::operator[](&local_4b8,"childIndexes");
        Json::Value::operator=(pVVar22,(Value *)&local_500);
        Json::Value::~Value((Value *)&local_500);
      }
      Json::Value::Value(&local_420,pDVar33->ProjectIndex);
      pVVar22 = Json::Value::operator[](&local_4b8,"projectIndex");
      Json::Value::operator=(pVVar22,&local_420);
      Json::Value::~Value(&local_420);
      bVar18 = Json::Value::empty(&pDVar33->TargetIndexes);
      if (!bVar18) {
        Json::Value::Value((Value *)local_490,&pDVar33->TargetIndexes);
        pVVar22 = Json::Value::operator[](&local_4b8,"targetIndexes");
        Json::Value::operator=(pVVar22,(Value *)local_490);
        Json::Value::~Value((Value *)local_490);
      }
      local_a8.Position.Position = (pDVar33->Snapshot).Position.Position;
      local_a8.State = (pDVar33->Snapshot).State;
      local_a8.Position.Tree = (pDVar33->Snapshot).Position.Tree;
      Json::Value::Value((Value *)&local_608,nullValue);
      local_3f8.string_ = (char *)&local_3e8;
      local_658.int_ = 0x1e;
      local_3f8.int_ = std::__cxx11::string::_M_create(&local_3f8.uint_,(ulong)&local_658);
      local_3e8._M_allocated_capacity = (size_type)local_658;
      (((_Rep_type *)local_3f8)->_M_impl).super__Rb_tree_header._M_header.field_0x6 = 'R';
      (((_Rep_type *)local_3f8)->_M_impl).super__Rb_tree_header._M_header.field_0x7 = 'E';
      *(char *)&(((_Rep_type *)local_3f8)->_M_impl).super__Rb_tree_header._M_header._M_parent = 'Q';
      *(char *)((long)&(((_Rep_type *)local_3f8)->_M_impl).super__Rb_tree_header._M_header._M_parent
               + 1) = 'U';
      *(char *)((long)&(((_Rep_type *)local_3f8)->_M_impl).super__Rb_tree_header._M_header._M_parent
               + 2) = 'I';
      *(char *)((long)&(((_Rep_type *)local_3f8)->_M_impl).super__Rb_tree_header._M_header._M_parent
               + 3) = 'R';
      *(char *)((long)&(((_Rep_type *)local_3f8)->_M_impl).super__Rb_tree_header._M_header._M_parent
               + 4) = 'E';
      *(char *)((long)&(((_Rep_type *)local_3f8)->_M_impl).super__Rb_tree_header._M_header._M_parent
               + 5) = 'D';
      builtin_strncpy((char *)((long)&(local_3f8.map_)->_M_t + 0x16),"_VERSION",8);
      builtin_strncpy((char *)local_3f8,"CMAKE_MI",8);
      *(undefined8 *)
       (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)&(local_3f8.map_)->_M_t)->_M_local_buf + 8) = 0x45525f4d554d494e;
      VStack_3f0.int_ = local_658.int_;
      local_3f8.string_[local_658.string_] = '\0';
      psVar30 = cmStateSnapshot::GetDefinition(&local_a8,(string *)&local_3f8);
      if (local_3f8 != &local_3e8) {
        operator_delete(local_3f8.string_,(ulong)(local_3e8._M_allocated_capacity + 1));
      }
      if (psVar30 != (string *)0x0) {
        Json::Value::Value((Value *)&local_3f8,objectValue);
        Json::Value::operator=((Value *)&local_608,(Value *)&local_3f8);
        Json::Value::~Value((Value *)&local_3f8);
        Json::Value::Value((Value *)&local_658,psVar30);
        pVVar22 = Json::Value::operator[]((Value *)&local_608,"string");
        Json::Value::operator=(pVVar22,(Value *)&local_658);
        Json::Value::~Value((Value *)&local_658);
      }
      bVar18 = Json::Value::isNull((Value *)&local_608);
      if (!bVar18) {
        Json::Value::Value((Value *)&local_3f8,(Value *)&local_608);
        pVVar22 = Json::Value::operator[](&local_4b8,"minimumCMakeVersion");
        Json::Value::operator=(pVVar22,(Value *)&local_3f8);
        Json::Value::~Value((Value *)&local_3f8);
      }
      if (pDVar33->HasInstallRule == true) {
        Json::Value::Value((Value *)&local_658,true);
        pVVar22 = Json::Value::operator[](&local_4b8,"hasInstallRule");
        Json::Value::operator=(pVVar22,(Value *)&local_658);
        Json::Value::~Value((Value *)&local_658);
      }
      Json::Value::~Value((Value *)&local_608);
      Json::Value::~Value((Value *)&local_528);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_468._M_dataplus._M_p != &local_468.field_2) {
        operator_delete(local_468._M_dataplus._M_p,local_468.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4d8._M_dataplus._M_p != &local_4d8.field_2) {
        operator_delete(local_4d8._M_dataplus._M_p,local_4d8.field_2._M_allocated_capacity + 1);
      }
      Json::Value::append(&local_d0,&local_4b8);
      Json::Value::~Value(&local_4b8);
      pDVar33 = pDVar33 + 1;
    } while (pDVar33 != pDVar39);
  }
  pVVar22 = Json::Value::operator[](local_618,"directories");
  Json::Value::operator=(pVVar22,&local_d0);
  Json::Value::~Value(&local_d0);
  Json::Value::Value(&local_f8,arrayValue);
  pPVar27 = (this->Projects).
            super__Vector_base<(anonymous_namespace)::CodemodelConfig::Project,_std::allocator<(anonymous_namespace)::CodemodelConfig::Project>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pPVar12 = (this->Projects).
            super__Vector_base<(anonymous_namespace)::CodemodelConfig::Project,_std::allocator<(anonymous_namespace)::CodemodelConfig::Project>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (pPVar27 != pPVar12) {
    do {
      Json::Value::Value((Value *)&local_528,objectValue);
      cmStateSnapshot::GetProjectName_abi_cxx11_((string *)&local_658,&pPVar27->Snapshot);
      Json::Value::Value((Value *)&local_3f8,(string *)&local_658);
      pVVar22 = Json::Value::operator[]((Value *)&local_528,"name");
      Json::Value::operator=(pVVar22,(Value *)&local_3f8);
      Json::Value::~Value((Value *)&local_3f8);
      if (local_658 != local_648) {
        operator_delete(local_658.string_,local_648[0]._M_allocated_capacity + 1);
      }
      if (pPVar27->ParentIndex != 0xffffffff) {
        Json::Value::Value((Value *)&local_658,pPVar27->ParentIndex);
        pVVar22 = Json::Value::operator[]((Value *)&local_528,"parentIndex");
        Json::Value::operator=(pVVar22,(Value *)&local_658);
        Json::Value::~Value((Value *)&local_658);
      }
      bVar18 = Json::Value::empty(&pPVar27->ChildIndexes);
      if (!bVar18) {
        Json::Value::Value((Value *)&local_5d0,&pPVar27->ChildIndexes);
        pVVar22 = Json::Value::operator[]((Value *)&local_528,"childIndexes");
        Json::Value::operator=(pVVar22,(Value *)&local_5d0);
        Json::Value::~Value((Value *)&local_5d0);
      }
      Json::Value::Value((Value *)&local_578,&pPVar27->DirectoryIndexes);
      pVVar22 = Json::Value::operator[]((Value *)&local_528,"directoryIndexes");
      Json::Value::operator=(pVVar22,(Value *)&local_578);
      Json::Value::~Value((Value *)&local_578);
      bVar18 = Json::Value::empty(&pPVar27->TargetIndexes);
      if (!bVar18) {
        Json::Value::Value((Value *)&local_5a8,&pPVar27->TargetIndexes);
        pVVar22 = Json::Value::operator[]((Value *)&local_528,"targetIndexes");
        Json::Value::operator=(pVVar22,(Value *)&local_5a8);
        Json::Value::~Value((Value *)&local_5a8);
      }
      Json::Value::append(&local_f8,(Value *)&local_528);
      Json::Value::~Value((Value *)&local_528);
      pPVar27 = pPVar27 + 1;
    } while (pPVar27 != pPVar12);
  }
  pVVar22 = Json::Value::operator[](local_618,"projects");
  Json::Value::operator=(pVVar22,&local_f8);
  Json::Value::~Value(&local_f8);
  return extraout_RAX;
}

Assistant:

Json::Value CodemodelConfig::Dump()
{
  Json::Value configuration = Json::objectValue;
  configuration["name"] = this->Config;
  this->ProcessDirectories();
  configuration["targets"] = this->DumpTargets();
  configuration["directories"] = this->DumpDirectories();
  configuration["projects"] = this->DumpProjects();
  return configuration;
}